

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O0

void __thiscall QMenu::initStyleOption(QMenu *this,QStyleOptionMenuItem *option,QAction *action)

{
  bool bVar1;
  undefined1 uVar2;
  byte bVar3;
  QMenuPrivate *this_00;
  QPalette *pQVar4;
  ulong uVar5;
  long lVar6;
  QMenu *pQVar7;
  qsizetype qVar8;
  undefined4 uVar9;
  QAction *in_RDX;
  long in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QRect QVar10;
  QMenuPrivate *d;
  QKeySequence seq;
  QString textAndAccel;
  undefined4 in_stack_ffffffffffffff08;
  CaseSensitivity in_stack_ffffffffffffff0c;
  enum_type in_stack_ffffffffffffff10;
  enum_type in_stack_ffffffffffffff14;
  undefined4 in_stack_ffffffffffffff20;
  QFlagsStorage<QStyle::StateFlag> in_stack_ffffffffffffff24;
  QWidget *b;
  QString *in_stack_ffffffffffffff40;
  undefined8 local_b8;
  undefined1 local_b0 [8];
  QWidget *in_stack_ffffffffffffff58;
  undefined1 *local_70;
  QChar local_62;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  QIcon local_48;
  QFontMetrics local_40 [12];
  undefined4 local_34;
  QAction *local_30;
  QFont local_28 [16];
  QFont local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RSI == 0) || (in_RDX == (QAction *)0x0)) goto LAB_00646194;
  b = in_RDI;
  local_30 = in_RDX;
  this_00 = d_func((QMenu *)0x645c6a);
  QStyleOption::initFrom
            ((QStyleOption *)this_00,
             (QWidget *)CONCAT44(in_stack_ffffffffffffff24.i,in_stack_ffffffffffffff20));
  pQVar4 = QWidget::palette((QWidget *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)
                           );
  QPalette::operator=((QPalette *)(in_RSI + 0x28),(QPalette *)pQVar4);
  QFlags<QStyle::StateFlag>::QFlags
            ((QFlags<QStyle::StateFlag> *)
             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),in_stack_ffffffffffffff0c
            );
  *(undefined4 *)(in_RSI + 8) = local_34;
  QWidget::window((QWidget *)CONCAT44(in_stack_ffffffffffffff24.i,in_stack_ffffffffffffff20));
  bVar1 = QWidget::isActiveWindow(in_stack_ffffffffffffff58);
  if (bVar1) {
    QFlags<QStyle::StateFlag>::operator|=((QFlags<QStyle::StateFlag> *)(in_RSI + 8),State_Active);
  }
  bVar1 = QWidget::isEnabled((QWidget *)0x645cec);
  if ((bVar1) && (uVar5 = QAction::isEnabled(), (uVar5 & 1) != 0)) {
    pQVar7 = QAction::menu<QMenu*>((QAction *)0x645d12);
    if (pQVar7 != (QMenu *)0x0) {
      QAction::menu<QMenu*>((QAction *)0x645d25);
      bVar1 = QWidget::isEnabled((QWidget *)0x645d2d);
      if (!bVar1) goto LAB_00645d48;
    }
    QFlags<QStyle::StateFlag>::operator|=((QFlags<QStyle::StateFlag> *)(in_RSI + 8),State_Enabled);
  }
  else {
LAB_00645d48:
    QPalette::setCurrentColorGroup((QPalette *)(in_RSI + 0x28),Disabled);
  }
  QAction::font();
  QWidget::font(in_RDI);
  QFont::resolve(local_18);
  QFont::operator=((QFont *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (QFont *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  QFont::~QFont(local_18);
  QFont::~QFont(local_28);
  QFontMetrics::QFontMetrics(local_40,(QFont *)(in_RSI + 0x88));
  QFontMetrics::operator=
            ((QFontMetrics *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             (QFontMetrics *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  QFontMetrics::~QFontMetrics(local_40);
  if (((this_00->currentAction != (QAction *)0x0) && (this_00->currentAction == local_30)) &&
     (uVar5 = QAction::isSeparator(), (uVar5 & 1) == 0)) {
    in_stack_ffffffffffffff24.i =
         (Int)::operator|(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10);
    QFlags<QStyle::StateFlag>::operator|=
              ((QFlags<QStyle::StateFlag> *)(in_RSI + 8),
               (QFlags<QStyle::StateFlag>)in_stack_ffffffffffffff24.i);
  }
  *(byte *)(in_RSI + 0x49) = (byte)(*(ushort *)&this_00->field_0x420 >> 1) & 1;
  uVar5 = QAction::isCheckable();
  if ((uVar5 & 1) == 0) {
    *(undefined4 *)(in_RSI + 0x44) = 0;
  }
  else {
    lVar6 = QAction::actionGroup();
    in_stack_ffffffffffffff14 =
         in_stack_ffffffffffffff14 &
         (State_KeyboardFocusChange|State_Editing|State_Sibling|State_Item|State_Children|State_Open
          |State_Window|State_Active|State_Selected|State_UpArrow|State_MouseOver|State_AutoRaise|
          State_FocusAtBorder|State_Bottom|State_Top|State_HasFocus|State_Horizontal|State_DownArrow
          |State_On|State_NoChange|State_Off|State_Sunken|State_Raised|State_Enabled);
    if (lVar6 != 0) {
      QAction::actionGroup();
      uVar2 = QActionGroup::isExclusive();
      in_stack_ffffffffffffff14 = CONCAT13(uVar2,(int3)in_stack_ffffffffffffff14);
    }
    uVar9 = 2;
    if ((in_stack_ffffffffffffff14 & 0x1000000) != State_None) {
      uVar9 = 1;
    }
    *(undefined4 *)(in_RSI + 0x44) = uVar9;
    bVar3 = QAction::isChecked();
    *(byte *)(in_RSI + 0x48) = bVar3 & 1;
  }
  pQVar7 = QAction::menu<QMenu*>((QAction *)0x645f27);
  if (pQVar7 == (QMenu *)0x0) {
    uVar5 = QAction::isSeparator();
    if ((uVar5 & 1) == 0) {
      bVar1 = ::operator==((QPointer<QAction> *)
                           CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                           (QAction **)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)
                          );
      if (bVar1) {
        *(undefined4 *)(in_RSI + 0x40) = 1;
      }
      else {
        *(undefined4 *)(in_RSI + 0x40) = 0;
      }
    }
    else {
      *(undefined4 *)(in_RSI + 0x40) = 2;
    }
  }
  else {
    *(undefined4 *)(in_RSI + 0x40) = 3;
  }
  uVar5 = QAction::isIconVisibleInMenu();
  if ((uVar5 & 1) != 0) {
    QAction::icon();
    QIcon::operator=((QIcon *)CONCAT44(in_stack_ffffffffffffff24.i,in_stack_ffffffffffffff20),
                     (QIcon *)in_RDI);
    QIcon::~QIcon(&local_48);
  }
  local_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  QAction::text();
  uVar5 = QAction::isShortcutVisibleInContextMenu();
  if (((uVar5 & 1) != 0) || (bVar1 = QMenuPrivate::isContextMenu((QMenuPrivate *)0x646041), !bVar1))
  {
    QChar::QChar<char16_t,_true>(&local_62,L'\t');
    qVar8 = QString::indexOf((QString *)in_RDI,(QChar)(char16_t)((ulong)b >> 0x30),
                             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                             in_stack_ffffffffffffff0c);
    if (qVar8 == -1) {
      local_70 = &DAT_aaaaaaaaaaaaaaaa;
      QAction::shortcut();
      uVar5 = QKeySequence::isEmpty();
      if ((uVar5 & 1) == 0) {
        QKeySequence::toString((SequenceFormat)local_b0);
        ::operator+((char16_t *)in_RDI,
                    (QString *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
        ::operator+=(in_stack_ffffffffffffff40,(QStringBuilder<char16_t,_QString> *)b);
        QStringBuilder<char16_t,_QString>::~QStringBuilder
                  ((QStringBuilder<char16_t,_QString> *)0x646103);
        QString::~QString((QString *)0x64610d);
      }
      QKeySequence::~QKeySequence((QKeySequence *)&local_70);
    }
  }
  QString::operator=((QString *)(in_RSI + 0x60),(QString *)&local_60);
  *(uint *)(in_RSI + 0x84) = this_00->tabWidth;
  *(uint *)(in_RSI + 0x80) = this_00->maxIconWidth;
  QVar10 = QWidget::rect((QWidget *)this_00);
  *(long *)(in_RSI + 0x4c) = QVar10._0_8_;
  local_b8 = QVar10._8_8_;
  *(undefined8 *)(in_RSI + 0x54) = local_b8;
  QString::~QString((QString *)0x646194);
LAB_00646194:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMenu::initStyleOption(QStyleOptionMenuItem *option, const QAction *action) const
{
    if (!option || !action)
        return;

    Q_D(const QMenu);
    option->initFrom(this);
    option->palette = palette();
    option->state = QStyle::State_None;

    if (window()->isActiveWindow())
        option->state |= QStyle::State_Active;
    if (isEnabled() && action->isEnabled()
            && (!action->menu() || action->menu()->isEnabled()))
        option->state |= QStyle::State_Enabled;
    else
        option->palette.setCurrentColorGroup(QPalette::Disabled);

    option->font = action->font().resolve(font());
    option->fontMetrics = QFontMetrics(option->font);

    if (d->currentAction && d->currentAction == action && !d->currentAction->isSeparator()) {
        option->state |= QStyle::State_Selected
                     | (QMenuPrivate::mouseDown ? QStyle::State_Sunken : QStyle::State_None);
    }

    option->menuHasCheckableItems = d->hasCheckableItems;
    if (!action->isCheckable()) {
        option->checkType = QStyleOptionMenuItem::NotCheckable;
    } else {
        option->checkType = (action->actionGroup() && action->actionGroup()->isExclusive())
                            ? QStyleOptionMenuItem::Exclusive : QStyleOptionMenuItem::NonExclusive;
        option->checked = action->isChecked();
    }
    if (action->menu())
        option->menuItemType = QStyleOptionMenuItem::SubMenu;
    else if (action->isSeparator())
        option->menuItemType = QStyleOptionMenuItem::Separator;
    else if (d->defaultAction == action)
        option->menuItemType = QStyleOptionMenuItem::DefaultItem;
    else
        option->menuItemType = QStyleOptionMenuItem::Normal;
    if (action->isIconVisibleInMenu())
        option->icon = action->icon();
    QString textAndAccel = action->text();
#ifndef QT_NO_SHORTCUT
    if ((action->isShortcutVisibleInContextMenu() || !d->isContextMenu())
            && textAndAccel.indexOf(u'\t') == -1) {
        QKeySequence seq = action->shortcut();
        if (!seq.isEmpty())
            textAndAccel += u'\t' + seq.toString(QKeySequence::NativeText);
    }
#endif
    option->text = textAndAccel;
    option->reservedShortcutWidth = d->tabWidth;
    option->maxIconWidth = d->maxIconWidth;
    option->menuRect = rect();
}